

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O2

maybe<int,_void> * __thiscall
pstore::broker::gc_watch_thread::get_pid
          (maybe<int,_void> *__return_storage_ptr__,gc_watch_thread *this,string *path)

{
  bool bVar1;
  type *ptVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->mut_);
  bVar1 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
          ::presentl(&this->processes_,path);
  if (bVar1) {
    ptVar2 = (type *)bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
                     ::getr(&this->processes_,path);
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = *ptVar2;
  }
  else {
    __return_storage_ptr__->valid_ = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return __return_storage_ptr__;
}

Assistant:

maybe<process_identifier> gc_watch_thread::get_pid (std::string const & path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (!processes_.presentl (path)) {
                return {};
            }
            return maybe<process_identifier>{processes_.getr (path)};
        }